

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_scientific.cpp
# Opt level: O3

int32_t __thiscall
icu_63::number::impl::ScientificHandler::getMultiplier(ScientificHandler *this,int32_t magnitude)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  
  cVar2 = this->fSettings->fEngineeringInterval;
  iVar4 = (int)cVar2;
  iVar3 = iVar4;
  if ((this->fSettings->fRequireMinInt == false) && (iVar3 = 1, '\x01' < cVar2)) {
    uVar1 = magnitude % iVar4 + iVar4;
    iVar3 = (short)((int)((uint)(ushort)((short)uVar1 >> 0xf) << 0x10 | uVar1 & 0xffff) %
                   (int)(short)cVar2) + 1;
  }
  return ~magnitude + iVar3;
}

Assistant:

int32_t ScientificHandler::getMultiplier(int32_t magnitude) const {
    int32_t interval = fSettings.fEngineeringInterval;
    int32_t digitsShown;
    if (fSettings.fRequireMinInt) {
        // For patterns like "000.00E0" and ".00E0"
        digitsShown = interval;
    } else if (interval <= 1) {
        // For patterns like "0.00E0" and "@@@E0"
        digitsShown = 1;
    } else {
        // For patterns like "##0.00"
        digitsShown = ((magnitude % interval + interval) % interval) + 1;
    }
    return digitsShown - magnitude - 1;
}